

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O0

void createNewFold(void)

{
  int iVar1;
  char *__command;
  ostream *this;
  int t;
  char *mkdirCommand;
  
  __command = catStrStr("mkdir ",answerAddress);
  iVar1 = system(__command);
  if (iVar1 != 0) {
    this = std::operator<<((ostream *)&std::cout,"can\'t create a new fold for answers");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  return;
}

Assistant:

void createNewFold(){
    const char *mkdirCommand = catStrStr("mkdir ",answerAddress);
    int t= system(mkdirCommand);
    if (t != 0){
        cout << "can't create a new fold for answers" << endl;
        exit(-1);
    }

}